

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeNF
          (ChElementHexaANCF_3813_9 *this,double U,double V,double W,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  char *__function;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  ShapeVector N;
  ChMatrixNM<double,_1,_11> Nz;
  ChMatrixNM<double,_1,_11> Ny;
  ChMatrixNM<double,_1,_11> Nx;
  ChMatrixNM<double,_1,_3> local_1c8;
  ChMatrixNM<double,_1,_3> local_1b0;
  ChMatrixNM<double,_1,_3> local_198;
  ShapeVector local_180;
  ShapeVector local_128;
  ShapeVector local_d0;
  ShapeVector local_78;
  
  ShapeFunctions(this,&local_180,U,V,W);
  dVar9 = Calc_detJ0(this,U,V,W,&local_78,&local_d0,&local_128,&local_198,&local_1b0,&local_1c8);
  *detJ = dVar9;
  *detJ = dVar9 * (this->m_dimensions).m_data[0] * (this->m_dimensions).m_data[1] *
                  (this->m_dimensions).m_data[2] * 0.125;
  if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3) {
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    lVar1 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    pdVar2 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar3 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar4 = 0;
    pdVar5 = pdVar2;
    while (lVar4 * 3 <= lVar1 + -3) {
      dVar9 = local_180.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
              m_data.array[lVar4];
      uVar6 = 3;
      if (((ulong)pdVar2 & 7) == 0) {
        uVar7 = -((uint)((ulong)(pdVar2 + lVar4 * 3) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar7 < 3) {
          uVar6 = (ulong)uVar7;
        }
        if (uVar7 != 0) goto LAB_006dd88b;
        uVar6 = 0;
LAB_006dd8ad:
        do {
          pdVar5[uVar6] = dVar9 * pdVar3[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      else {
LAB_006dd88b:
        uVar8 = 0;
        do {
          pdVar5[uVar8] = dVar9 * pdVar3[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        if ((int)uVar6 != 3) goto LAB_006dd8ad;
      }
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 3;
      if (lVar4 == 0xb) {
        return;
      }
    }
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det(J) here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ShapeVector N;
    ShapeFunctions(N, U, V, W);

    detJ = Calc_detJ0(U, V, W);
    detJ *= m_dimensions.x() * m_dimensions.y() * m_dimensions.z() / 8;

    for (int i = 0; i < 11; i++) {
        Qi.segment(3 * i, 3) = N(i) * F.segment(0, 3);
    }
}